

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

ssize_t __thiscall
duckdb_fmt::v6::internal::
arg_formatter_base<duckdb_fmt::v6::buffer_range<wchar_t>,_duckdb_fmt::v6::internal::error_handler>::
write(arg_formatter_base<duckdb_fmt::v6::buffer_range<wchar_t>,_duckdb_fmt::v6::internal::error_handler>
      *this,int __fd,void *__buf,size_t __n)

{
  format_specs *specs;
  buffer<wchar_t> *pbVar1;
  size_t sVar2;
  int iVar3;
  size_t sVar4;
  ulong uVar5;
  size_t extraout_RAX;
  undefined4 extraout_var;
  void *pvVar7;
  InternalException *this_00;
  wchar_t *data;
  undefined4 in_register_00000034;
  wchar_t *__s;
  string local_50;
  size_t sVar6;
  
  __s = (wchar_t *)CONCAT44(in_register_00000034,__fd);
  if (__s == (wchar_t *)0x0) {
    this_00 = (InternalException *)__cxa_allocate_exception(0x10);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"string pointer is null","")
    ;
    duckdb::InternalException::InternalException(this_00,&local_50);
    __cxa_throw(this_00,&duckdb::InternalException::typeinfo,std::runtime_error::~runtime_error);
  }
  sVar4 = wcslen(__s);
  specs = this->specs_;
  if (specs == (format_specs *)0x0) {
    pbVar1 = (this->writer_).out_.container;
    sVar2 = pbVar1->size_;
    uVar5 = sVar2 + sVar4;
    sVar6 = sVar4;
    if (pbVar1->capacity_ < uVar5) {
      iVar3 = (**pbVar1->_vptr_buffer)(pbVar1,uVar5);
      sVar6 = CONCAT44(extraout_var,iVar3);
    }
    pbVar1->size_ = uVar5;
    if (sVar4 != 0) {
      pvVar7 = memmove(pbVar1->ptr_ + sVar2,__s,sVar4 << 2);
      return (ssize_t)pvVar7;
    }
  }
  else {
    uVar5 = (ulong)specs->precision;
    local_50._M_string_length = sVar4;
    if (uVar5 < sVar4) {
      local_50._M_string_length = uVar5;
    }
    if ((long)uVar5 < 0) {
      local_50._M_string_length = sVar4;
    }
    local_50._M_dataplus._M_p = (pointer)__s;
    basic_writer<duckdb_fmt::v6::buffer_range<wchar_t>>::
    write_padded<duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<wchar_t>>::str_writer<wchar_t>>
              ((basic_writer<duckdb_fmt::v6::buffer_range<wchar_t>> *)this,specs,
               (str_writer<wchar_t> *)&local_50);
    sVar6 = extraout_RAX;
  }
  return sVar6;
}

Assistant:

void write(const char_type* value) {
    if (!value) {
      FMT_THROW(duckdb::InternalException("string pointer is null"));
    } else {
      auto length = std::char_traits<char_type>::length(value);
      basic_string_view<char_type> sv(value, length);
      specs_ ? writer_.write(sv, *specs_) : writer_.write(sv);
    }
  }